

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O0

void __thiscall TasGrid::GridWavelet::loadGpuCoefficients<double>(GridWavelet *this)

{
  AccelerationContext *acc;
  bool bVar1;
  pointer pCVar2;
  const_iterator ibegin;
  const_iterator iend;
  unique_ptr<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
  local_20;
  unique_ptr *local_18;
  unique_ptr<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
  *ccache;
  GridWavelet *this_local;
  
  ccache = (unique_ptr<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
            *)this;
  local_18 = (unique_ptr *)getGpuCache<double>(this);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool(local_18);
  if (!bVar1) {
    Utils::make_unique<TasGrid::CudaWaveletData<double>>();
    ::std::
    unique_ptr<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
    ::operator=((unique_ptr<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
                 *)local_18,&local_20);
    ::std::
    unique_ptr<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
    ::~unique_ptr(&local_20);
  }
  pCVar2 = ::std::
           unique_ptr<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
           ::operator->((unique_ptr<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
                         *)local_18);
  bVar1 = GpuVector<double>::empty(&pCVar2->coefficients);
  if (bVar1) {
    pCVar2 = ::std::
             unique_ptr<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
             ::operator->((unique_ptr<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
                           *)local_18);
    acc = (this->super_BaseCanonicalGrid).acceleration;
    ibegin = Data2D<double>::begin(&this->coefficients);
    iend = Data2D<double>::end(&this->coefficients);
    GpuVector<double>::
    load<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
              (&pCVar2->coefficients,acc,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               ibegin._M_current,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               iend._M_current);
  }
  return;
}

Assistant:

void GridWavelet::loadGpuCoefficients() const{
    auto &ccache = getGpuCache<T>();
    if (!ccache) ccache = Utils::make_unique<CudaWaveletData<T>>();
    if (ccache->coefficients.empty()) ccache->coefficients.load(acceleration, coefficients.begin(), coefficients.end());
}